

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

int __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::close(mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
        *this,int __fd)

{
  limited_dynamic_demand_queue *queue;
  _Map_pointer ppdVar1;
  size_t sVar2;
  _Elt_pointer pdVar3;
  _Elt_pointer pdVar4;
  _Map_pointer ppdVar5;
  _Elt_pointer pdVar6;
  _Elt_pointer pdVar7;
  _Elt_pointer args_2;
  undefined8 *puVar8;
  select_case_t *psVar9;
  int iVar10;
  select_case_t *psVar11;
  composed_action_name local_40;
  
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  if (this->m_status == closed) goto LAB_0020e2de;
  this->m_status = closed;
  ppdVar1 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  sVar2 = (this->m_queue).m_max_size;
  pdVar3 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar4 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppdVar5 = (this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar6 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pdVar7 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  if (__fd == 0) {
    if (pdVar6 != pdVar3) {
      queue = &this->m_queue;
      do {
        details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>
                  (queue);
        args_2 = (this->m_queue).m_queue.
                 super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_40.m_1 = "service_request";
        if (args_2->m_demand_type == event) {
          local_40.m_1 = "message";
        }
        local_40.m_2 = "dropped_on_close";
        impl::msg_tracing_helpers::details::
        make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
                  ((this->super_mchain_tracing_enabled_base).m_tracer,
                   &this->super_abstract_message_chain_t,&local_40,&args_2->m_msg_type,
                   &args_2->m_message_ref);
        details::ensure_queue_not_empty<so_5::mchain_props::details::limited_dynamic_demand_queue&>
                  (queue);
        std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::
        pop_front(&queue->m_queue);
      } while ((this->m_queue).m_queue.
               super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               (this->m_queue).m_queue.
               super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
LAB_0020e24a:
    psVar11 = this->m_select_tail;
    if (psVar11 != (select_case_t *)0x0) {
      this->m_select_tail = (select_case_t *)0x0;
      do {
        puVar8 = *(undefined8 **)(psVar11 + 0x10);
        psVar9 = *(select_case_t **)(psVar11 + 0x18);
        *(undefined8 *)(psVar11 + 0x10) = 0;
        *(undefined8 *)(psVar11 + 0x18) = 0;
        (**(code **)*puVar8)();
        psVar11 = psVar9;
      } while (psVar9 != (select_case_t *)0x0);
    }
  }
  else if (pdVar6 == pdVar3) goto LAB_0020e24a;
  if (this->m_threads_to_wakeup != 0) {
    std::condition_variable::notify_all();
  }
  if (sVar2 == ((long)pdVar4 - (long)pdVar3 >> 3) * -0x5555555555555555 +
               ((long)pdVar6 - (long)pdVar7 >> 3) * -0x5555555555555555 +
               (((long)ppdVar1 - (long)ppdVar5 >> 3) + -1 + (ulong)(ppdVar1 == (_Map_pointer)0x0)) *
               0x15) {
    std::condition_variable::notify_all();
  }
LAB_0020e2de:
  iVar10 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar10;
}

Assistant:

virtual void
		close( close_mode_t mode ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				if( details::status::closed == m_status )
					return;

				m_status = details::status::closed;

				const bool was_full = m_queue.is_full();

				if( close_mode_t::drop_content == mode )
					{
						while( !m_queue.is_empty() )
							{
								this->trace_demand_drop_on_close(
										*this, m_queue.front() );
								m_queue.pop_front();
							}
					}

				// If queue is empty now and there is any multi chain select
				// than select_tail must be handled.
				if( m_queue.is_empty() )
					notify_multi_chain_select_ops();

				if( m_threads_to_wakeup )
					// Someone is waiting on empty chain for new messages.
					// It must be informed that no new messages will be here.
					m_underflow_cond.notify_all();

				if( was_full )
					// Someone can wait on full chain for free place for new message.
					// It must be informed that the chain is closed.
					m_overflow_cond.notify_all();
			}